

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

void __thiscall
mp::internal::NLProblemBuilder<StrictMockProblemBuilder>::AddVariables
          (NLProblemBuilder<StrictMockProblemBuilder> *this,NLHeader *h)

{
  int *piVar1;
  undefined8 uVar2;
  CStringRef in_RSI;
  int num_nl_vars_in_objs_only;
  int num_nl_vars;
  int k;
  Type in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  NLProblemBuilder<StrictMockProblemBuilder> *in_stack_ffffffffffffffa0;
  BasicCStringRef<char> local_48 [3];
  BasicCStringRef<char> local_30;
  int local_24 [2];
  int in_stack_ffffffffffffffe4;
  int iVar3;
  int iVar4;
  
  iVar4 = 0;
  piVar1 = std::max<int>((int *)((long)in_RSI.data_ + 0x50),(int *)((long)in_RSI.data_ + 0x54));
  iVar3 = *piVar1;
  if (iVar3 != 0) {
    DoAddVars(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98,
              (int *)0x237019);
    DoAddVars(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98,
              (int *)0x237035);
    DoAddVars(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98,
              (int *)0x237060);
    DoAddVars(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98,
              (int *)0x23707c);
    local_24[1] = 0;
    local_24[0] = *(int *)((long)in_RSI.data_ + 0x54) - *(int *)((long)in_RSI.data_ + 0x50);
    piVar1 = std::max<int>(local_24 + 1,local_24);
    in_stack_ffffffffffffffe4 = *piVar1;
    if (in_stack_ffffffffffffffe4 != 0) {
      DoAddVars(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98,
                (int *)0x2370d1);
      DoAddVars(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98,
                (int *)0x2370ed);
    }
  }
  if (iVar3 == iVar4) {
    DoAddVars(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98,
              (int *)0x237198);
    DoAddVars(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98,
              (int *)0x2371bc);
    if (*(int *)in_RSI.data_ == iVar4) {
      return;
    }
    uVar2 = __cxa_allocate_exception(0x18);
    fmt::BasicCStringRef<char>::BasicCStringRef(local_48,"NLProblemBuilder: num_vars mismatch");
    Error::Error((Error *)CONCAT44(iVar4,iVar3),in_RSI,in_stack_ffffffffffffffe4);
    __cxa_throw(uVar2,&Error::typeinfo,Error::~Error);
  }
  uVar2 = __cxa_allocate_exception(0x18);
  fmt::BasicCStringRef<char>::BasicCStringRef(&local_30,"NLProblemBuilder: num_nl_vars mismatch");
  Error::Error((Error *)CONCAT44(iVar4,iVar3),in_RSI,in_stack_ffffffffffffffe4);
  __cxa_throw(uVar2,&Error::typeinfo,Error::~Error);
}

Assistant:

void AddVariables(const NLHeader& h) {
    // Distinguish NL variable order
    // See D.M.Gay, Hooking Your Solver to AMPL;
    //     D.M.Gay, Writing .NL Files;
    // and, e.g.,
    // github.com/jump-dev/MathOptInterface.jl/blob/master/src/FileFormats/NL/README.md
    int k=0;                             // current block position
    const int num_nl_vars = std::max(h.num_nl_vars_in_cons,
                                     h.num_nl_vars_in_objs);
    if (num_nl_vars) {
      DoAddVars(h.num_nl_vars_in_both - h.num_nl_integer_vars_in_both,
              var::CONTINUOUS, k);
      DoAddVars(h.num_nl_integer_vars_in_both,
              var::INTEGER, k);
      DoAddVars(h.num_nl_vars_in_cons -
              (h.num_nl_vars_in_both + h.num_nl_integer_vars_in_cons),
              var::CONTINUOUS, k);
      DoAddVars(h.num_nl_integer_vars_in_cons,
              var::INTEGER, k);
      int num_nl_vars_in_objs_only =
          std::max(0, h.num_nl_vars_in_objs - h.num_nl_vars_in_cons);
      if (num_nl_vars_in_objs_only) {
        DoAddVars(num_nl_vars_in_objs_only - h.num_nl_integer_vars_in_objs,
                var::CONTINUOUS, k);
        DoAddVars(h.num_nl_integer_vars_in_objs,
                var::INTEGER, k);
      }
    }
    MP_ASSERT_ALWAYS(num_nl_vars == k, "NLProblemBuilder: num_nl_vars mismatch");
    DoAddVars(h.num_vars -
            (num_nl_vars +
             h.num_linear_integer_vars + h.num_linear_binary_vars),
            var::CONTINUOUS, k);
    DoAddVars(h.num_linear_integer_vars + h.num_linear_binary_vars,
            var::INTEGER, k);
    MP_ASSERT_ALWAYS(h.num_vars == k, "NLProblemBuilder: num_vars mismatch");
  }